

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O3

void __thiscall
wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t::process
          (start_of_frame_1_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  state_base_t *psVar1;
  state_base_t *psVar2;
  size_t sVar3;
  
  if ((symbol->super_type).m_initialized == false) {
    this->cnt = 0;
    return;
  }
  sVar3 = 0;
  if ((symbol->super_type).m_storage != false) {
    sVar3 = this->cnt + 1;
  }
  this->cnt = sVar3;
  if (sVar3 == 5) {
    psVar2 = (state_base_t *)operator_new(0x10);
    psVar2->_vptr_state_base_t = (_func_int **)&PTR_process_00113ce8;
    psVar2[1]._vptr_state_base_t = (_func_int **)0x0;
    psVar1 = (ctx->current_state_m)._M_t.
             super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
             .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>
             ._M_head_impl;
    (ctx->current_state_m)._M_t.
    super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
    _M_head_impl = psVar2;
    if (psVar1 != (state_base_t *)0x0) {
      operator_delete(psVar1);
      return;
    }
  }
  return;
}

Assistant:

void
start_of_frame_1_t::process(symbol_sm_t& ctx,
                            const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        cnt = 0;
    }
    else
    {
        cnt = *symbol ? cnt + 1 : 0;
        if (cnt == 5) // we wait for 5 consecutive '1' (the last 1 of the
                      // preamble, plus the first nibble of the SOF)
        {
            ctx.state(
              std::unique_ptr<start_of_frame_0_t>(new start_of_frame_0_t()));
        }
    }
}